

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void notValid(Parse *pParse,NameContext *pNC,char *zMsg,int validMask)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = pNC->ncFlags;
  if (((uint)uVar1 & validMask) != 0) {
    pcVar3 = "CHECK constraints";
    if ((uVar1 & 4) == 0) {
      pcVar3 = "partial index WHERE clauses";
    }
    pcVar2 = "index expressions";
    if ((uVar1 & 0x20) == 0) {
      pcVar2 = pcVar3;
    }
    sqlite3ErrorMsg(pParse,"%s prohibited in %s",zMsg,pcVar2);
    return;
  }
  return;
}

Assistant:

static void notValid(
  Parse *pParse,       /* Leave error message here */
  NameContext *pNC,    /* The name context */
  const char *zMsg,    /* Type of error */
  int validMask        /* Set of contexts for which prohibited */
){
  assert( (validMask&~(NC_IsCheck|NC_PartIdx|NC_IdxExpr))==0 );
  if( (pNC->ncFlags & validMask)!=0 ){
    const char *zIn = "partial index WHERE clauses";
    if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
    else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
    sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  }
}